

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O2

int ompt_get_partition_place_nums(int place_nums_size,int *place_nums)

{
  uint uVar1;
  uint uVar2;
  kmp_info_t *pkVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  iVar6 = 0;
  iVar9 = 0;
  if ((ompt_enabled._0_1_ & 1) != 0) {
    iVar5 = __kmp_get_global_thread_id();
    iVar9 = iVar6;
    if ((-1 < iVar5) && (__kmp_affin_mask_size != 0)) {
      iVar6 = __kmp_get_global_thread_id_reg();
      pkVar3 = __kmp_threads[iVar6];
      if (pkVar3 != (kmp_info_t *)0x0) {
        uVar1 = (pkVar3->th).th_first_place;
        uVar2 = (pkVar3->th).th_last_place;
        if (-1 < (int)(uVar1 | uVar2)) {
          uVar7 = uVar2;
          if (uVar1 < uVar2) {
            uVar7 = uVar1;
          }
          uVar4 = uVar2;
          if (uVar2 < uVar1) {
            uVar4 = uVar1;
          }
          lVar8 = (ulong)uVar1 - (ulong)uVar2;
          lVar10 = -lVar8;
          if (0 < lVar8) {
            lVar10 = lVar8;
          }
          if ((int)lVar10 <= place_nums_size) {
            for (; (int)uVar7 <= (int)uVar4; uVar7 = uVar7 + 1) {
              *place_nums = uVar7;
              place_nums = (int *)((uint *)place_nums + 1);
            }
          }
          iVar9 = (int)lVar10 + 1;
        }
      }
    }
  }
  return iVar9;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_partition_place_nums(int place_nums_size,
                                                   int *place_nums) {
// copied from kmp_ftn_entry.h (but modified)
#if !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  if (!ompt_enabled.enabled || __kmp_get_gtid() < 0)
    return 0;

  int i, gtid, place_num, first_place, last_place, start, end;
  kmp_info_t *thread;
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  if (thread == NULL)
    return 0;
  first_place = thread->th.th_first_place;
  last_place = thread->th.th_last_place;
  if (first_place < 0 || last_place < 0)
    return 0;
  if (first_place <= last_place) {
    start = first_place;
    end = last_place;
  } else {
    start = last_place;
    end = first_place;
  }
  if (end - start <= place_nums_size)
    for (i = 0, place_num = start; place_num <= end; ++place_num, ++i) {
      place_nums[i] = place_num;
    }
  return end - start + 1;
#endif
}